

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIso2.c
# Opt level: O0

void Gia_Iso2ManCollectOrder2_rec(Gia_Man_t *p,int Id,Vec_Int_t *vVec)

{
  uint uVar1;
  int iVar2;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pObj;
  Vec_Int_t *vVec_local;
  int Id_local;
  Gia_Man_t *p_local;
  
  iVar2 = Gia_ObjIsTravIdCurrentId(p,Id);
  if (iVar2 == 0) {
    Gia_ObjSetTravIdCurrentId(p,Id);
    pObj_00 = Gia_ManObj(p,Id);
    iVar2 = Gia_ObjIsAnd(pObj_00);
    if (iVar2 == 0) {
      iVar2 = Gia_ObjIsCo(pObj_00);
      if (iVar2 == 0) {
        iVar2 = Gia_ObjIsPi(p,pObj_00);
        if ((iVar2 == 0) && (iVar2 = Gia_ObjIsConst0(pObj_00), iVar2 == 0)) {
          __assert_fail("Gia_ObjIsConst0(pObj)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIso2.c"
                        ,0x198,"void Gia_Iso2ManCollectOrder2_rec(Gia_Man_t *, int, Vec_Int_t *)");
        }
      }
      else {
        iVar2 = Gia_ObjFaninId0(pObj_00,Id);
        Gia_Iso2ManCollectOrder2_rec(p,iVar2,vVec);
      }
    }
    else {
      pGVar3 = Gia_ObjFanin0(pObj_00);
      uVar1 = pGVar3->Value;
      pGVar3 = Gia_ObjFanin1(pObj_00);
      if (pGVar3->Value < uVar1) {
        iVar2 = Gia_ObjFaninId1(pObj_00,Id);
        Gia_Iso2ManCollectOrder2_rec(p,iVar2,vVec);
        iVar2 = Gia_ObjFaninId0(pObj_00,Id);
        Gia_Iso2ManCollectOrder2_rec(p,iVar2,vVec);
      }
      else {
        iVar2 = Gia_ObjFaninId0(pObj_00,Id);
        Gia_Iso2ManCollectOrder2_rec(p,iVar2,vVec);
        iVar2 = Gia_ObjFaninId1(pObj_00,Id);
        Gia_Iso2ManCollectOrder2_rec(p,iVar2,vVec);
      }
    }
    Vec_IntPush(vVec,Id);
  }
  return;
}

Assistant:

void Gia_Iso2ManCollectOrder2_rec( Gia_Man_t * p, int Id, Vec_Int_t * vVec )
{
    Gia_Obj_t * pObj;
    if ( Gia_ObjIsTravIdCurrentId(p, Id) )
        return;
    Gia_ObjSetTravIdCurrentId(p, Id);
    pObj = Gia_ManObj( p, Id );
    if ( Gia_ObjIsAnd(pObj) )
    {
        if ( Gia_ObjFanin0(pObj)->Value <= Gia_ObjFanin1(pObj)->Value )
        {
            Gia_Iso2ManCollectOrder2_rec( p, Gia_ObjFaninId0(pObj, Id), vVec );
            Gia_Iso2ManCollectOrder2_rec( p, Gia_ObjFaninId1(pObj, Id), vVec );
        }
        else
        {
            Gia_Iso2ManCollectOrder2_rec( p, Gia_ObjFaninId1(pObj, Id), vVec );
            Gia_Iso2ManCollectOrder2_rec( p, Gia_ObjFaninId0(pObj, Id), vVec );
        }
    }
    else if ( Gia_ObjIsCo(pObj) )
    {
        Gia_Iso2ManCollectOrder2_rec( p, Gia_ObjFaninId0(pObj, Id), vVec );
    }
    else if ( Gia_ObjIsPi(p, pObj) )
    {
    }
    else assert( Gia_ObjIsConst0(pObj) );
    Vec_IntPush( vVec, Id );
}